

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordwrap.c
# Opt level: O0

void wordwrap(BinarySink *bs,ptrlen input,size_t maxwid)

{
  ptrlen pl;
  size_t newcol;
  ptrlen word;
  size_t col;
  size_t maxwid_local;
  BinarySink *bs_local;
  ptrlen input_local;
  
  input_local.ptr = (void *)input.len;
  bs_local = (BinarySink *)input.ptr;
  word.len = 0;
  while( true ) {
    pl = ptrlen_get_word((ptrlen *)&bs_local," ");
    word.ptr = (void *)pl.len;
    if (word.ptr == (void *)0x0) break;
    if (word.len != 0) {
      if (maxwid < word.len + 1 + (long)word.ptr) {
        BinarySink_put_byte(bs->binarysink_,'\n');
        word.len = 0;
      }
      else {
        BinarySink_put_byte(bs->binarysink_,' ');
        word.len = word.len + 1;
      }
    }
    BinarySink_put_datapl(bs->binarysink_,pl);
    word.len = (long)word.ptr + word.len;
  }
  return;
}

Assistant:

void wordwrap(BinarySink *bs, ptrlen input, size_t maxwid)
{
    size_t col = 0;
    while (true) {
        ptrlen word = ptrlen_get_word(&input, " ");
        if (!word.len)
            break;

        /* At the start of a line, any word is legal, even if it's
         * overlong, because we have to display it _somehow_ and
         * wrapping to the next line won't make it any better. */
        if (col > 0) {
            size_t newcol = col + 1 + word.len;
            if (newcol <= maxwid) {
                put_byte(bs, ' ');
                col++;
            } else {
                put_byte(bs, '\n');
                col = 0;
            }
        }

        put_datapl(bs, word);
        col += word.len;
    }
}